

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

void __thiscall DialogPrompt::draw(DialogPrompt *this,RenderTarget *target,RenderStates states)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer pCVar3;
  Transform *right;
  TextButton *b;
  pointer drawable;
  pointer drawable_00;
  pointer drawable_01;
  
  if ((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') {
    right = sf::Transformable::getTransform(&(this->super_UIComponent).super_Transformable);
    sf::operator*=(&states.transform,right);
    sf::RenderTarget::draw(target,(Drawable *)&this->background,&states);
    sf::RenderTarget::draw(target,&(this->text).super_Drawable,&states);
    pTVar1 = (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (drawable = (this->optionButtons).
                    super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
                    super__Vector_impl_data._M_start; drawable != pTVar1; drawable = drawable + 1) {
      sf::RenderTarget::draw(target,(Drawable *)drawable,&states);
    }
    pTVar2 = (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (drawable_00 = (this->optionFields).
                       super__Vector_base<TextField,_std::allocator<TextField>_>._M_impl.
                       super__Vector_impl_data._M_start; drawable_00 != pTVar2;
        drawable_00 = drawable_00 + 1) {
      sf::RenderTarget::draw(target,(Drawable *)drawable_00,&states);
    }
    pCVar3 = (this->optionChecks).super__Vector_base<CheckBox,_std::allocator<CheckBox>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (drawable_01 = (this->optionChecks).super__Vector_base<CheckBox,_std::allocator<CheckBox>_>.
                       _M_impl.super__Vector_impl_data._M_start; drawable_01 != pCVar3;
        drawable_01 = drawable_01 + 1) {
      sf::RenderTarget::draw(target,(Drawable *)drawable_01,&states);
    }
  }
  return;
}

Assistant:

void DialogPrompt::draw(RenderTarget& target, RenderStates states) const {
    if (visible) {
        states.transform *= getTransform();
        target.draw(background, states);
        target.draw(text, states);
        for (const TextButton& b : optionButtons) {
            target.draw(b, states);
        }
        for (const TextField& f : optionFields) {
            target.draw(f, states);
        }
        for (const CheckBox& c : optionChecks) {
            target.draw(c, states);
        }
    }
}